

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O2

int Res_WinCollectLeavesAndNodes(Res_Win_t *p)

{
  Vec_Vec_t *p_00;
  Abc_Obj_t *p_01;
  int iVar1;
  Vec_Ptr_t *pVVar2;
  long *plVar3;
  void *pvVar4;
  uint uVar5;
  uint uVar6;
  int i;
  int iVar7;
  char *__assertion;
  int iVar8;
  long lVar9;
  
  if (p->nWinTfiMax < 1) {
    __assertion = "p->nWinTfiMax > 0";
    uVar5 = 0x6a;
  }
  else {
    p_00 = p->vMatrix;
    iVar8 = p_00->nSize;
    if (p->nWinTfiMax < iVar8) {
      for (iVar7 = 0; iVar7 < iVar8; iVar7 = iVar7 + 1) {
        pVVar2 = Vec_VecEntry(p_00,iVar7);
        pVVar2->nSize = 0;
        iVar8 = p_00->nSize;
      }
      iVar8 = 0;
      Vec_VecPush(p->vMatrix,0,p->pNode);
      Abc_NtkIncrementTravId(p->pNode->pNtk);
      Abc_NodeSetTravIdCurrent(p->pNode);
      p->vLeaves->nSize = 0;
      while( true ) {
        iVar7 = p->nWinTfiMax;
        if (iVar7 < iVar8) break;
        pVVar2 = Vec_VecEntry(p->vMatrix,iVar8);
        for (iVar7 = 0; iVar7 < pVVar2->nSize; iVar7 = iVar7 + 1) {
          plVar3 = (long *)Vec_PtrEntry(pVVar2,iVar7);
          for (lVar9 = 0; lVar9 < *(int *)((long)plVar3 + 0x1c); lVar9 = lVar9 + 1) {
            p_01 = *(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                    (long)*(int *)(plVar3[4] + lVar9 * 4) * 8);
            iVar1 = Abc_NodeIsTravIdCurrent(p_01);
            if (iVar1 == 0) {
              Abc_NodeSetTravIdCurrent(p_01);
              uVar5 = *(uint *)&p_01->field_0x14 & 0xf;
              if (((uVar5 == 2) || (uVar5 == 5)) ||
                 (iVar1 = (*(uint *)&p->pNode->field_0x14 >> 0xc) -
                          (*(uint *)&p_01->field_0x14 >> 0xc), p->nWinTfiMax < iVar1)) {
                Vec_PtrPush(p->vLeaves,p_01);
              }
              else {
                Vec_VecPush(p->vMatrix,iVar1,p_01);
              }
            }
          }
        }
        iVar8 = iVar8 + 1;
      }
      if (p->vLeaves->nSize == 0) {
        iVar8 = 0;
      }
      else {
        p->vNodes->nSize = 0;
        for (; -1 < iVar7; iVar7 = iVar7 + -1) {
          pVVar2 = Vec_VecEntry(p->vMatrix,iVar7);
          for (iVar8 = 0; iVar8 < pVVar2->nSize; iVar8 = iVar8 + 1) {
            pvVar4 = Vec_PtrEntry(pVVar2,iVar8);
            Vec_PtrPush(p->vNodes,pvVar4);
          }
          pVVar2->nSize = 0;
        }
        p->nLevLeafMin = 1000000000;
        uVar5 = 1000000000;
        for (iVar8 = 0; iVar8 < p->vLeaves->nSize; iVar8 = iVar8 + 1) {
          pvVar4 = Vec_PtrEntry(p->vLeaves,iVar8);
          uVar5 = *(uint *)((long)pvVar4 + 0x14) >> 0xc;
          if (p->nLevLeafMin < (int)uVar5) {
            uVar5 = p->nLevLeafMin;
          }
          p->nLevLeafMin = uVar5;
        }
        uVar6 = (*(uint *)&p->pNode->field_0x14 >> 0xc) - (p->nWinTfiMax + p->nLevTfiMinus);
        if ((int)uVar6 <= (int)uVar5) {
          uVar6 = uVar5;
        }
        p->nLevTravMin = uVar6;
        if ((int)uVar6 < 0) {
          __assert_fail("p->nLevTravMin >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                        ,0x98,"int Res_WinCollectLeavesAndNodes(Res_Win_t *)");
        }
        iVar8 = 1;
      }
      return iVar8;
    }
    __assertion = "Vec_VecSize(p->vMatrix) > p->nWinTfiMax";
    uVar5 = 0x6b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                ,uVar5,"int Res_WinCollectLeavesAndNodes(Res_Win_t *)");
}

Assistant:

int Res_WinCollectLeavesAndNodes( Res_Win_t * p )
{
    Vec_Ptr_t * vFront;
    Abc_Obj_t * pObj, * pTemp;
    int i, k, m;

    assert( p->nWinTfiMax > 0 );
    assert( Vec_VecSize(p->vMatrix) > p->nWinTfiMax );

    // start matrix with the node
    Vec_VecClear( p->vMatrix );
    Vec_VecPush( p->vMatrix, 0, p->pNode );
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Abc_NodeSetTravIdCurrent( p->pNode );

    // collect the leaves (nodes pTemp such that "p->pNode->Level - pTemp->Level > p->nWinTfiMax")
    Vec_PtrClear( p->vLeaves );
    Vec_VecForEachLevelStartStop( p->vMatrix, vFront, i, 0, p->nWinTfiMax+1 )
    {
        Vec_PtrForEachEntry( Abc_Obj_t *, vFront, pObj, k )
        {
            Abc_ObjForEachFanin( pObj, pTemp, m )
            {
                if ( Abc_NodeIsTravIdCurrent( pTemp ) )
                    continue;
                Abc_NodeSetTravIdCurrent( pTemp );
                if ( Abc_ObjIsCi(pTemp) || (int)(p->pNode->Level - pTemp->Level) > p->nWinTfiMax )                    
                    Vec_PtrPush( p->vLeaves, pTemp );
                else
                    Vec_VecPush( p->vMatrix, p->pNode->Level - pTemp->Level, pTemp );
            }
        }
    }
    if ( Vec_PtrSize(p->vLeaves) == 0 )
        return 0;

    // collect the nodes in the reverse order
    Vec_PtrClear( p->vNodes );
    Vec_VecForEachLevelReverseStartStop( p->vMatrix, vFront, i, p->nWinTfiMax+1, 0 )
    {
        Vec_PtrForEachEntry( Abc_Obj_t *, vFront, pObj, k )
            Vec_PtrPush( p->vNodes, pObj );
        Vec_PtrClear( vFront );
    }

    // get the lowest leaf level
    p->nLevLeafMin = ABC_INFINITY;
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pObj, k )
        p->nLevLeafMin = Abc_MinInt( p->nLevLeafMin, (int)pObj->Level );

    // set minimum traversal level
    p->nLevTravMin = Abc_MaxInt( ((int)p->pNode->Level) - p->nWinTfiMax - p->nLevTfiMinus, p->nLevLeafMin );
    assert( p->nLevTravMin >= 0 );
    return 1;
}